

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O0

void Ssw_ManCleanup(Ssw_Man_t *p)

{
  Aig_Obj_t **__s;
  int iVar1;
  Ssw_Man_t *p_local;
  
  if (p->pMSat == (Ssw_Sat_t *)0x0) {
    if (p->pFrames != (Aig_Man_t *)0x0) {
      Aig_ManCleanMarkAB(p->pFrames);
      Aig_ManStop(p->pFrames);
      p->pFrames = (Aig_Man_t *)0x0;
      __s = p->pNodeToFrames;
      iVar1 = Aig_ManObjNumMax(p->pAig);
      memset(__s,0,(long)iVar1 * 8 * (long)p->nFrames);
    }
    if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p->vSimInfo);
      p->vSimInfo = (Vec_Ptr_t *)0x0;
    }
    p->nConstrTotal = 0;
    p->nConstrReduced = 0;
    return;
  }
  __assert_fail("p->pMSat == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswMan.c"
                ,0xa1,"void Ssw_ManCleanup(Ssw_Man_t *)");
}

Assistant:

void Ssw_ManCleanup( Ssw_Man_t * p )
{
//    Aig_ManCleanMarkAB( p->pAig );
    assert( p->pMSat == NULL );
    if ( p->pFrames )
    {
        Aig_ManCleanMarkAB( p->pFrames );
        Aig_ManStop( p->pFrames );
        p->pFrames = NULL;
        memset( p->pNodeToFrames, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p->pAig) * p->nFrames );
    }
    if ( p->vSimInfo )
    {
        Vec_PtrFree( p->vSimInfo );
        p->vSimInfo = NULL;
    }
    p->nConstrTotal = 0;
    p->nConstrReduced = 0;
}